

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  bool bVar1;
  uint local_3c;
  curl_slist *pcStack_38;
  int port;
  char *host;
  curl_slist *pcStack_28;
  CURLcode result;
  curl_slist *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  host._4_4_ = CURLE_OK;
  pcStack_38 = (curl_slist *)0x0;
  local_3c = 0xffffffff;
  pcStack_28 = conn_to_host;
  conn_to_host_local = (curl_slist *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    bVar1 = false;
    if ((pcStack_28 != (curl_slist *)0x0) && (bVar1 = false, pcStack_38 == (curl_slist *)0x0)) {
      bVar1 = local_3c == 0xffffffff;
    }
    if (!bVar1) break;
    host._4_4_ = parse_connect_to_string
                           ((Curl_easy *)conn_local,(connectdata *)conn_to_host_local,
                            pcStack_28->data,(char **)&stack0xffffffffffffffc8,(int *)&local_3c);
    if (host._4_4_ != CURLE_OK) {
      return host._4_4_;
    }
    if ((pcStack_38 == (curl_slist *)0x0) || (*(char *)&pcStack_38->data == '\0')) {
      *(undefined1 *)((long)&conn_to_host_local[0x39].data + 3) = 0;
      (*Curl_cfree)(pcStack_38);
      pcStack_38 = (curl_slist *)0x0;
    }
    else {
      conn_to_host_local[0xe].next = pcStack_38;
      conn_to_host_local[0xf].next = pcStack_38;
      *(undefined1 *)((long)&conn_to_host_local[0x39].data + 3) = 1;
      Curl_infof((Curl_easy *)conn_local,"Connecting to hostname: %s\n",pcStack_38);
    }
    if ((int)local_3c < 0) {
      *(undefined1 *)((long)&conn_to_host_local[0x39].data + 4) = 0;
      local_3c = 0xffffffff;
    }
    else {
      *(uint *)((long)&conn_to_host_local[0x19].data + 4) = local_3c;
      *(undefined1 *)((long)&conn_to_host_local[0x39].data + 4) = 1;
      Curl_infof((Curl_easy *)conn_local,"Connecting to port: %d\n",(ulong)local_3c);
    }
    pcStack_28 = pcStack_28->next;
  }
  return host._4_4_;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}